

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCore.c
# Opt level: O0

Aig_MmFixed_t * Dar_ManComputeCuts(Aig_Man_t *pAig,int nCutsMax,int fSkipTtMin,int fVerbose)

{
  undefined8 p_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  Aig_Obj_t *pObj_00;
  abctime aVar4;
  uint local_80;
  uint local_7c;
  int nCutsK;
  int nCuts;
  abctime clk;
  int nNodes;
  int i;
  Aig_MmFixed_t *pMemCuts;
  Aig_Obj_t *pObj;
  Dar_RwrPar_t *pPars;
  Dar_RwrPar_t Pars;
  Dar_Man_t *p;
  int fVerbose_local;
  int fSkipTtMin_local;
  int nCutsMax_local;
  Aig_Man_t *pAig_local;
  
  pObj = (Aig_Obj_t *)((long)&pPars + 4);
  _nCutsK = Abc_Clock();
  clk._0_4_ = Aig_ManCleanup(pAig);
  Dar_ManDefaultRwrParams((Dar_RwrPar_t *)pObj);
  (pObj->field_0).CioId = nCutsMax;
  Pars._28_8_ = Dar_ManStart(pAig,(Dar_RwrPar_t *)pObj);
  Aig_MmFixedRestart(((Dar_Man_t *)Pars._28_8_)->pMemCuts);
  p_00 = Pars._28_8_;
  pObj_00 = Aig_ManConst1(*(Aig_Man_t **)(Pars._28_8_ + 8));
  Dar_ObjPrepareCuts((Dar_Man_t *)p_00,pObj_00);
  for (clk._4_4_ = 0; iVar3 = clk._4_4_, iVar1 = Vec_PtrSize(pAig->vCis), iVar3 < iVar1;
      clk._4_4_ = clk._4_4_ + 1) {
    pMemCuts = (Aig_MmFixed_t *)Vec_PtrEntry(pAig->vCis,clk._4_4_);
    Dar_ObjPrepareCuts((Dar_Man_t *)Pars._28_8_,(Aig_Obj_t *)pMemCuts);
  }
  for (clk._4_4_ = 0; iVar3 = clk._4_4_, iVar1 = Vec_PtrSize(pAig->vObjs), iVar3 < iVar1;
      clk._4_4_ = clk._4_4_ + 1) {
    pMemCuts = (Aig_MmFixed_t *)Vec_PtrEntry(pAig->vObjs,clk._4_4_);
    if ((pMemCuts != (Aig_MmFixed_t *)0x0) &&
       (iVar3 = Aig_ObjIsNode((Aig_Obj_t *)pMemCuts), iVar3 != 0)) {
      Dar_ObjComputeCuts((Dar_Man_t *)Pars._28_8_,(Aig_Obj_t *)pMemCuts,fSkipTtMin);
    }
  }
  if (fVerbose != 0) {
    local_7c = Dar_ManCutCount(pAig,(int *)&local_80);
    uVar2 = Aig_ManObjNum(pAig);
    printf("Nodes = %6d. Total cuts = %6d. 4-input cuts = %6d.\n",(ulong)uVar2,(ulong)local_7c,
           (ulong)local_80);
    iVar3 = Aig_MmFixedReadMemUsage(*(Aig_MmFixed_t **)(Pars._28_8_ + 0x10));
    printf("Cut size = %2d. Truth size = %2d. Total mem = %5.2f MB  ",
           ((double)iVar3 * 1.0) / 1048576.0,0x18,4);
    Abc_Print(1,"%s =","Runtime");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - _nCutsK) * 1.0) / 1000000.0);
  }
  _nNodes = *(Aig_MmFixed_t **)(Pars._28_8_ + 0x10);
  *(undefined8 *)(Pars._28_8_ + 0x10) = 0;
  Dar_ManStop((Dar_Man_t *)Pars._28_8_);
  return _nNodes;
}

Assistant:

Aig_MmFixed_t * Dar_ManComputeCuts( Aig_Man_t * pAig, int nCutsMax, int fSkipTtMin, int fVerbose )
{ 
    Dar_Man_t * p;
    Dar_RwrPar_t Pars, * pPars = &Pars; 
    Aig_Obj_t * pObj;
    Aig_MmFixed_t * pMemCuts;
    int i, nNodes;
    abctime clk = Abc_Clock();
    // remove dangling nodes
    if ( (nNodes = Aig_ManCleanup( pAig )) )
    {
//        printf( "Removing %d nodes.\n", nNodes );
    }
    // create default parameters
    Dar_ManDefaultRwrParams( pPars );
    pPars->nCutsMax = nCutsMax;
    // create rewriting manager
    p = Dar_ManStart( pAig, pPars );
    // set elementary cuts for the PIs
//    Dar_ManCutsStart( p );
    Aig_MmFixedRestart( p->pMemCuts );
    Dar_ObjPrepareCuts( p, Aig_ManConst1(p->pAig) );
    Aig_ManForEachCi( pAig, pObj, i )
        Dar_ObjPrepareCuts( p, pObj );
    // compute cuts for each nodes in the topological order
    Aig_ManForEachNode( pAig, pObj, i )
        Dar_ObjComputeCuts( p, pObj, fSkipTtMin );
    // print verbose stats
    if ( fVerbose )
    {
//        Aig_Obj_t * pObj;
        int nCuts, nCutsK;//, i;
        nCuts = Dar_ManCutCount( pAig, &nCutsK );
        printf( "Nodes = %6d. Total cuts = %6d. 4-input cuts = %6d.\n",
            Aig_ManObjNum(pAig), nCuts, nCutsK );
        printf( "Cut size = %2d. Truth size = %2d. Total mem = %5.2f MB  ",
            (int)sizeof(Dar_Cut_t), (int)4, 1.0*Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20) );
        ABC_PRT( "Runtime", Abc_Clock() - clk );
/*
        Aig_ManForEachNode( pAig, pObj, i )
            if ( i % 300 == 0 )
                Dar_ObjCutPrint( pAig, pObj );
*/
    }
    // free the cuts
    pMemCuts = p->pMemCuts;
    p->pMemCuts = NULL;
//    Dar_ManCutsFree( p );
    // stop the rewriting manager
    Dar_ManStop( p );
    return pMemCuts;
}